

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fs_write_alotof_bufs(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  __off64_t _Var6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  char *pcVar8;
  long unaff_R12;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  uv_buf_t uVar14;
  undefined1 auStack_72 [2];
  code *pcStack_70;
  undefined8 uStack_68;
  void *pvStack_60;
  long lStack_58;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0xd4310;
  pvVar4 = malloc(0xd4310);
  if (pvVar4 == (void *)0x0) {
LAB_00158a3c:
    fs_write_alotof_bufs_cold_18();
LAB_00158a41:
    fs_write_alotof_bufs_cold_1();
LAB_00158a46:
    fs_write_alotof_bufs_cold_2();
LAB_00158a4b:
    fs_write_alotof_bufs_cold_3();
LAB_00158a50:
    fs_write_alotof_bufs_cold_4();
LAB_00158a55:
    fs_write_alotof_bufs_cold_17();
LAB_00158a5a:
    fs_write_alotof_bufs_cold_5();
LAB_00158a5f:
    fs_write_alotof_bufs_cold_6();
LAB_00158a64:
    fs_write_alotof_bufs_cold_7();
LAB_00158a69:
    fs_write_alotof_bufs_cold_8();
LAB_00158a6e:
    fs_write_alotof_bufs_cold_9();
LAB_00158a73:
    fs_write_alotof_bufs_cold_10();
LAB_00158a78:
    fs_write_alotof_bufs_cold_12();
LAB_00158a7d:
    fs_write_alotof_bufs_cold_13();
LAB_00158a82:
    fs_write_alotof_bufs_cold_14();
LAB_00158a87:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158a41;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a46;
    uv_fs_req_cleanup(&open_req1);
    lVar10 = 8;
    do {
      auVar13 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar4 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar4 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar4,0xd431,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158a4b;
    if (write_req.result != 0xac67d) goto LAB_00158a50;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0xac67d;
    pvVar5 = malloc(0xac67d);
    if (pvVar5 == (void *)0x0) goto LAB_00158a55;
    lVar10 = 8;
    pvVar11 = pvVar5;
    do {
      auVar13 = uv_buf_init(pvVar11,0xd);
      *(long *)((long)pvVar4 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar4 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
      pvVar11 = (void *)((long)pvVar11 + 0xd);
    } while (lVar10 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar2 != 0) goto LAB_00158a5a;
    if (close_req.result != 0) goto LAB_00158a5f;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_00158a64;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a69;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar4,0xd431,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158a6e;
    if (read_req.result != 0x3400) goto LAB_00158a73;
    unaff_R12 = 0;
    do {
      pcVar8 = (char *)((long)pvVar5 + unaff_R12);
      iVar2 = strncmp(pcVar8,test_buf,0xd);
      iVar3 = (int)pcVar8;
      if (iVar2 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158a3c;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar5);
    iVar3 = (int)open_req1.result;
    _Var6 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00158a78;
    iov = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 0) goto LAB_00158a7d;
    if (read_req.result != 0) goto LAB_00158a82;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158a87;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar4);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar3);
  fs_write_alotof_bufs_with_offset(iVar3);
  pvVar4 = (void *)uv_default_loop();
  uv_walk(pvVar4,close_walk_cb,0);
  uv_run(pvVar4,0);
  uVar7 = uv_default_loop();
  iVar3 = uv_loop_close(uVar7);
  if (iVar3 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_70 = (code *)0x158af0;
  uStack_68 = extraout_RAX;
  pvStack_60 = pvVar4;
  lStack_58 = unaff_R12;
  unlink("test_file");
  pcStack_70 = (code *)0x158af5;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_70 = (code *)0x158b06;
  pvVar5 = malloc(0xd4310);
  if (pvVar5 == (void *)0x0) {
LAB_00158e4b:
    pvVar5 = pvVar4;
    pcStack_70 = (code *)0x158e50;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158e50:
    pcStack_70 = (code *)0x158e55;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158e55:
    pcStack_70 = (code *)0x158e5a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158e5a:
    pcStack_70 = (code *)0x158e5f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158e5f:
    pcStack_70 = (code *)0x158e64;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158e64:
    pcStack_70 = (code *)0x158e69;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158e69:
    pcStack_70 = (code *)0x158e6e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158e6e:
    pcStack_70 = (code *)0x158e73;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158e73:
    pcStack_70 = (code *)0x158e78;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158e78:
    pcStack_70 = (code *)0x158e7d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158e7d:
    pcStack_70 = (code *)0x158e82;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158e82:
    pcStack_70 = (code *)0x158e87;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158e87:
    pcStack_70 = (code *)0x158e8c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158e8c:
    pcStack_70 = (code *)0x158e91;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158e91:
    pcStack_70 = (code *)0x158e96;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_70 = (code *)0x158b35;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00158e50;
    if (open_req1.result._4_4_ < 0) goto LAB_00158e55;
    pcStack_70 = (code *)0x158b57;
    uv_fs_req_cleanup(&open_req1);
    pcStack_70 = (code *)0x158b68;
    uVar14 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_68 = 0;
    pcStack_70 = (code *)0x158ba6;
    iov = uVar14;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 10) goto LAB_00158e5a;
    if (write_req.result != 10) goto LAB_00158e5f;
    pcStack_70 = (code *)0x158bc9;
    uv_fs_req_cleanup(&write_req);
    lVar10 = 8;
    do {
      pcStack_70 = (code *)0x158be3;
      auVar13 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar5 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar5 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0xd4318);
    uStack_68 = 0;
    pcStack_70 = (code *)0x158c24;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar5,0xd431,10);
    if (iVar3 < 0) goto LAB_00158e64;
    if (write_req.result != 0xac67d) goto LAB_00158e69;
    pcStack_70 = (code *)0x158c49;
    uv_fs_req_cleanup(&write_req);
    pcStack_70 = (code *)0x158c53;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_00158e6e;
    lVar10 = 8;
    pcVar12 = pcVar8;
    do {
      pcStack_70 = (code *)0x158c75;
      auVar13 = uv_buf_init(pcVar12,0xd);
      *(long *)((long)pvVar5 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar5 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar10 != 0xd4318);
    uStack_68 = 0;
    pcStack_70 = (code *)0x158cba;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar5,0xd431,10);
    if (iVar3 < 0) goto LAB_00158e73;
    lVar10 = 0xd;
    if (iVar3 != 0xd) {
      lVar10 = 0x3400;
    }
    if (read_req.result != lVar10) goto LAB_00158e78;
    pcVar12 = pcVar8;
    uVar9 = 0;
    do {
      pcStack_70 = (code *)0x158cff;
      iVar2 = strncmp(pcVar12,test_buf,0xd);
      if (iVar2 != 0) {
        pcStack_70 = (code *)0x158e4b;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar4 = pvVar5;
        goto LAB_00158e4b;
      }
      if (iVar3 == 0xd) break;
      pcVar12 = pcVar12 + 0xd;
      bVar1 = uVar9 < 0x3ff;
      uVar9 = uVar9 + 1;
    } while (bVar1);
    pcStack_70 = (code *)0x158d2c;
    uv_fs_req_cleanup(&read_req);
    pcStack_70 = (code *)0x158d34;
    free(pcVar8);
    pcStack_70 = (code *)0x158d4b;
    iVar3 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar3 != 0) goto LAB_00158e7d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00158e82;
    pcStack_70 = (code *)0x158d7b;
    uv_fs_req_cleanup(&stat_req);
    pcStack_70 = (code *)0x158d8c;
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_68 = 0;
    pcStack_70 = (code *)0x158dce;
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar3 != 0) goto LAB_00158e87;
    if (read_req.result != 0) goto LAB_00158e8c;
    pcStack_70 = (code *)0x158df0;
    uv_fs_req_cleanup(&read_req);
    pcStack_70 = (code *)0x158e06;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158e91;
    if (close_req.result == 0) {
      pcStack_70 = (code *)0x158e24;
      uv_fs_req_cleanup(&close_req);
      pcStack_70 = (code *)0x158e30;
      unlink("test_file");
      free(pvVar5);
      return;
    }
  }
  pcStack_70 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_70 = (code *)pvVar5;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar3 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar3 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015900d;
    iVar3 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar3 < 0) goto LAB_00159012;
    uv_fs_req_cleanup(&open_req1);
    uVar14 = (uv_buf_t)uv_buf_init(auStack_72,2);
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar3 != -0x15) goto LAB_00159017;
    uv_fs_req_cleanup(&read_req);
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      uVar7 = uv_default_loop();
      iVar3 = uv_loop_close(uVar7);
      if (iVar3 == 0) {
        return;
      }
      goto LAB_00159021;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015900d:
    run_test_fs_read_dir_cold_2();
LAB_00159012:
    run_test_fs_read_dir_cold_3();
LAB_00159017:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159021:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_alotof_bufs(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;

  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  -1,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
    NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, iovcount, -1, NULL);
  if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT(r >= 0);
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  ASSERT(lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result);
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 -1,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}